

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

nodemodule * NodeClassModule(anynode *Any,fourcc_t ClassId)

{
  nodeclass *pnVar1;
  nodemodule *Any_00;
  
  if (Any != (anynode *)0x0) {
    Any_00 = (nodemodule *)**(undefined8 **)((long)Any + 8);
    if (ClassId == 0) {
      pnVar1 = (nodeclass *)0x0;
    }
    else {
      pnVar1 = NodeContext_FindClass(Any_00,ClassId);
    }
    if (pnVar1 != (nodeclass *)0x0) {
      Any_00 = pnVar1->Module;
    }
    return Any_00;
  }
  __assert_fail("(const void*)(Any)!=NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                ,0x5a4,"nodemodule *NodeClassModule(anynode *, fourcc_t)");
}

Assistant:

nodemodule* NodeClassModule(anynode* Any,fourcc_t ClassId)
{
    nodecontext* p = Node_Context(Any);
    nodemodule* Module = NULL;
    const nodeclass* Class = NULL;
    if (ClassId)
    {
        Class = NodeContext_FindClass(p,ClassId);
    }
    if (Class)
        Module = Class->Module;
    else
        Module = &p->Base;
    return Module;
}